

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void xfer_download_queue(fxp_xfer *xfer)

{
  req *data;
  char *pcVar1;
  sftp_request *req_00;
  byte local_21;
  sftp_request *req;
  req *rr;
  fxp_xfer *xfer_local;
  
  while( true ) {
    local_21 = 0;
    if ((xfer->req_totalsize < xfer->req_maxsize) && (local_21 = 0, (xfer->eof & 1U) == 0)) {
      local_21 = xfer->err ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    data = (req *)safemalloc(1,0x30,0);
    data->offset = xfer->offset;
    data->complete = 0;
    if (xfer->tail == (req *)0x0) {
      xfer->head = data;
      data->prev = (req *)0x0;
    }
    else {
      xfer->tail->next = data;
      data->prev = xfer->tail;
    }
    xfer->tail = data;
    data->next = (req *)0x0;
    data->len = 0x8000;
    pcVar1 = (char *)safemalloc((long)data->len,1,0);
    data->buffer = pcVar1;
    req_00 = fxp_read_send(xfer->fh,data->offset,data->len);
    sftp_register(req_00);
    fxp_set_userdata(req_00,data);
    xfer->offset = (long)data->len + xfer->offset;
    xfer->req_totalsize = data->len + xfer->req_totalsize;
  }
  return;
}

Assistant:

void xfer_download_queue(struct fxp_xfer *xfer)
{
    while (xfer->req_totalsize < xfer->req_maxsize &&
           !xfer->eof && !xfer->err) {
        /*
         * Queue a new read request.
         */
        struct req *rr;
        struct sftp_request *req;

        rr = snew(struct req);
        rr->offset = xfer->offset;
        rr->complete = 0;
        if (xfer->tail) {
            xfer->tail->next = rr;
            rr->prev = xfer->tail;
        } else {
            xfer->head = rr;
            rr->prev = NULL;
        }
        xfer->tail = rr;
        rr->next = NULL;

        rr->len = 32768;
        rr->buffer = snewn(rr->len, char);
        sftp_register(req = fxp_read_send(xfer->fh, rr->offset, rr->len));
        fxp_set_userdata(req, rr);

        xfer->offset += rr->len;
        xfer->req_totalsize += rr->len;

#ifdef DEBUG_DOWNLOAD
        printf("queueing read request %p at %"PRIu64"\n", rr, rr->offset);
#endif
    }
}